

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<8,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  undefined4 uVar34;
  ulong unaff_R14;
  undefined8 uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  vfloat<8> tNear;
  vint8 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 (*local_2580) [16];
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  float local_2560 [4];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined4 local_24a0;
  undefined4 uStack_249c;
  undefined4 uStack_2498;
  undefined4 uStack_2494;
  undefined4 uStack_2490;
  undefined4 uStack_248c;
  undefined4 uStack_2488;
  undefined4 uStack_2484;
  undefined4 local_2480;
  undefined4 uStack_247c;
  undefined4 uStack_2478;
  undefined4 uStack_2474;
  undefined4 uStack_2470;
  undefined4 uStack_246c;
  undefined4 uStack_2468;
  undefined4 uStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  uint uVar57;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar38 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar37 = vrsqrtss_avx(auVar38,auVar38);
    fVar44 = auVar37._0_4_;
    local_2560[0] = fVar44 * 1.5 - auVar38._0_4_ * 0.5 * fVar44 * fVar44 * fVar44;
    local_24e0 = aVar2.x;
    auVar45._0_4_ = local_24e0 * local_2560[0];
    auVar45._4_4_ = aVar2.y * local_2560[0];
    auVar45._8_4_ = aVar2.z * local_2560[0];
    auVar45._12_4_ = aVar2.field_3.w * local_2560[0];
    auVar37 = vshufpd_avx(auVar45,auVar45,1);
    auVar38 = vmovshdup_avx(auVar45);
    auVar60._8_4_ = 0x80000000;
    auVar60._0_8_ = 0x8000000080000000;
    auVar60._12_4_ = 0x80000000;
    auVar48._12_4_ = 0;
    auVar48._0_12_ = ZEXT812(0);
    auVar48 = auVar48 << 0x20;
    auVar58 = vunpckhps_avx(auVar45,auVar48);
    auVar51 = vshufps_avx(auVar58,ZEXT416(auVar38._0_4_ ^ 0x80000000),0x41);
    auVar58._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
    auVar58._8_8_ = auVar60._8_8_ ^ auVar37._8_8_;
    auVar58 = vinsertps_avx(auVar58,auVar45,0x2a);
    auVar38 = vdpps_avx(auVar51,auVar51,0x7f);
    auVar37 = vdpps_avx(auVar58,auVar58,0x7f);
    auVar38 = vcmpps_avx(auVar37,auVar38,1);
    auVar61._0_4_ = auVar38._0_4_;
    auVar61._4_4_ = auVar61._0_4_;
    auVar61._8_4_ = auVar61._0_4_;
    auVar61._12_4_ = auVar61._0_4_;
    auVar38 = vblendvps_avx(auVar58,auVar51,auVar61);
    auVar37 = vdpps_avx(auVar38,auVar38,0x7f);
    auVar58 = vrsqrtss_avx(auVar37,auVar37);
    fVar44 = auVar58._0_4_;
    fVar44 = fVar44 * 1.5 - auVar37._0_4_ * 0.5 * fVar44 * fVar44 * fVar44;
    auVar51._0_4_ = auVar38._0_4_ * fVar44;
    auVar51._4_4_ = auVar38._4_4_ * fVar44;
    auVar51._8_4_ = auVar38._8_4_ * fVar44;
    auVar51._12_4_ = auVar38._12_4_ * fVar44;
    auVar38 = vshufps_avx(auVar51,auVar51,0xc9);
    auVar37 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar62._0_4_ = auVar37._0_4_ * auVar51._0_4_;
    auVar62._4_4_ = auVar37._4_4_ * auVar51._4_4_;
    auVar62._8_4_ = auVar37._8_4_ * auVar51._8_4_;
    auVar62._12_4_ = auVar37._12_4_ * auVar51._12_4_;
    auVar38 = vfmsub231ps_fma(auVar62,auVar45,auVar38);
    auVar58 = vshufps_avx(auVar38,auVar38,0xc9);
    auVar38 = vdpps_avx(auVar58,auVar58,0x7f);
    auVar37 = vrsqrtss_avx(auVar38,auVar38);
    fVar44 = auVar37._0_4_;
    fVar44 = fVar44 * 1.5 - fVar44 * fVar44 * fVar44 * auVar38._0_4_ * 0.5;
    auVar37._0_4_ = fVar44 * auVar58._0_4_;
    auVar37._4_4_ = fVar44 * auVar58._4_4_;
    auVar37._8_4_ = fVar44 * auVar58._8_4_;
    auVar37._12_4_ = fVar44 * auVar58._12_4_;
    auVar38._0_4_ = local_2560[0] * auVar45._0_4_;
    auVar38._4_4_ = local_2560[0] * auVar45._4_4_;
    auVar38._8_4_ = local_2560[0] * auVar45._8_4_;
    auVar38._12_4_ = local_2560[0] * auVar45._12_4_;
    auVar58 = vunpcklps_avx(auVar51,auVar38);
    auVar38 = vunpckhps_avx(auVar51,auVar38);
    auVar51 = vunpcklps_avx(auVar37,auVar48);
    auVar37 = vunpckhps_avx(auVar37,auVar48);
    local_2530 = vunpcklps_avx(auVar38,auVar37);
    local_2550 = vunpcklps_avx(auVar58,auVar51);
    local_2540 = vunpckhps_avx(auVar58,auVar51);
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar58 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar46._8_4_ = 0x7fffffff;
      auVar46._0_8_ = 0x7fffffff7fffffff;
      auVar46._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx((undefined1  [16])aVar2,auVar46);
      auVar49._8_4_ = 0x219392ef;
      auVar49._0_8_ = 0x219392ef219392ef;
      auVar49._12_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar38,auVar49,1);
      auVar38 = vblendvps_avx((undefined1  [16])aVar2,auVar49,auVar38);
      auVar51 = vrcpps_avx(auVar38);
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = &DAT_3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar38 = vfnmadd231ps_fma(auVar52,auVar51,auVar38);
      auVar45 = vfmadd132ps_fma(auVar38,auVar51,auVar51);
      local_2480 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      uStack_247c = local_2480;
      uStack_2478 = local_2480;
      uStack_2474 = local_2480;
      uStack_2470 = local_2480;
      uStack_246c = local_2480;
      uStack_2468 = local_2480;
      uStack_2464 = local_2480;
      local_24a0 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      uStack_249c = local_24a0;
      uStack_2498 = local_24a0;
      uStack_2494 = local_24a0;
      uStack_2490 = local_24a0;
      uStack_248c = local_24a0;
      uStack_2488 = local_24a0;
      uStack_2484 = local_24a0;
      local_24c0 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      uStack_24bc = local_24c0;
      uStack_24b8 = local_24c0;
      uStack_24b4 = local_24c0;
      uStack_24b0 = local_24c0;
      uStack_24ac = local_24c0;
      uStack_24a8 = local_24c0;
      uStack_24a4 = local_24c0;
      fStack_24dc = local_24e0;
      fStack_24d8 = local_24e0;
      fStack_24d4 = local_24e0;
      fStack_24d0 = local_24e0;
      fStack_24cc = local_24e0;
      fStack_24c8 = local_24e0;
      fStack_24c4 = local_24e0;
      auVar38 = vmovshdup_avx((undefined1  [16])aVar2);
      local_2500 = auVar38._0_8_;
      uStack_24f8 = local_2500;
      uStack_24f0 = local_2500;
      uStack_24e8 = local_2500;
      auVar38 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xaa);
      local_2520 = auVar38._0_8_;
      uStack_2518 = local_2520;
      uStack_2510 = local_2520;
      uStack_2508 = local_2520;
      fVar44 = auVar45._0_4_;
      local_25a0._4_4_ = fVar44;
      local_25a0._0_4_ = fVar44;
      local_25a0._8_4_ = fVar44;
      local_25a0._12_4_ = fVar44;
      local_25a0._16_4_ = fVar44;
      local_25a0._20_4_ = fVar44;
      local_25a0._24_4_ = fVar44;
      local_25a0._28_4_ = fVar44;
      auVar63 = ZEXT3264(local_25a0);
      auVar38 = vmovshdup_avx(auVar45);
      uVar35 = auVar38._0_8_;
      local_25c0._8_8_ = uVar35;
      local_25c0._0_8_ = uVar35;
      local_25c0._16_8_ = uVar35;
      local_25c0._24_8_ = uVar35;
      auVar64 = ZEXT3264(local_25c0);
      auVar48 = vshufpd_avx(auVar45,auVar45,1);
      auVar51 = vshufps_avx(auVar45,auVar45,0xaa);
      auVar53._0_4_ = fVar44 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar53._4_4_ = auVar45._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar53._8_4_ = auVar45._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar53._12_4_ = auVar45._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      uVar35 = auVar51._0_8_;
      local_25e0._8_8_ = uVar35;
      local_25e0._0_8_ = uVar35;
      local_25e0._16_8_ = uVar35;
      local_25e0._24_8_ = uVar35;
      auVar67 = ZEXT3264(local_25e0);
      uVar29 = (ulong)(fVar44 < 0.0) * 0x20;
      auVar51 = vmovshdup_avx(auVar53);
      auVar45 = vshufps_avx(auVar53,auVar53,0xaa);
      uVar30 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
      uVar33 = (ulong)(auVar48._0_4_ < 0.0) << 5 | 0x80;
      uVar34 = auVar37._0_4_;
      local_2600._4_4_ = uVar34;
      local_2600._0_4_ = uVar34;
      local_2600._8_4_ = uVar34;
      local_2600._12_4_ = uVar34;
      local_2600._16_4_ = uVar34;
      local_2600._20_4_ = uVar34;
      local_2600._24_4_ = uVar34;
      local_2600._28_4_ = uVar34;
      auVar68 = ZEXT3264(local_2600);
      uVar34 = auVar58._0_4_;
      auVar36 = ZEXT3264(CONCAT428(uVar34,CONCAT424(uVar34,CONCAT420(uVar34,CONCAT416(uVar34,
                                                  CONCAT412(uVar34,CONCAT48(uVar34,CONCAT44(uVar34,
                                                  uVar34))))))));
      uVar22 = CONCAT44(auVar53._0_4_,auVar53._0_4_);
      local_2620._0_8_ = uVar22 ^ 0x8000000080000000;
      local_2620._8_4_ = -auVar53._0_4_;
      local_2620._12_4_ = -auVar53._0_4_;
      local_2620._16_4_ = -auVar53._0_4_;
      local_2620._20_4_ = -auVar53._0_4_;
      local_2620._24_4_ = -auVar53._0_4_;
      local_2620._28_4_ = -auVar53._0_4_;
      auVar69 = ZEXT3264(local_2620);
      uVar24 = auVar51._0_4_;
      uVar57 = auVar51._4_4_;
      local_2640._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
      local_2640._8_4_ = uVar24 ^ 0x80000000;
      local_2640._12_4_ = uVar57 ^ 0x80000000;
      local_2640._16_4_ = uVar24 ^ 0x80000000;
      local_2640._20_4_ = uVar57 ^ 0x80000000;
      local_2640._24_4_ = uVar24 ^ 0x80000000;
      local_2640._28_4_ = uVar57 ^ 0x80000000;
      auVar59 = ZEXT3264(local_2640);
      uVar24 = auVar45._0_4_;
      uVar57 = auVar45._4_4_;
      local_2660._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      local_2660._8_4_ = uVar24 ^ 0x80000000;
      local_2660._12_4_ = uVar57 ^ 0x80000000;
      local_2660._16_4_ = uVar24 ^ 0x80000000;
      local_2660._20_4_ = uVar57 ^ 0x80000000;
      local_2660._24_4_ = uVar24 ^ 0x80000000;
      local_2660._28_4_ = uVar57 ^ 0x80000000;
      auVar56 = ZEXT3264(local_2660);
      local_2580 = (undefined1 (*) [16])local_2390;
      do {
        pauVar31 = local_2580;
        do {
          if (pauVar31 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar32 = pauVar31 + -1;
          pauVar31 = pauVar31 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar32 + 8));
        uVar22 = *(ulong *)*pauVar31;
        do {
          if ((uVar22 & 8) == 0) {
            fVar44 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar24 = (uint)uVar22 & 7;
            uVar21 = uVar22 & 0xfffffffffffffff0;
            if (uVar24 == 3) {
              local_2400 = *(undefined1 (*) [32])(uVar21 + 0x40);
              local_23e0 = *(undefined1 (*) [32])(uVar21 + 0x60);
              pauVar1 = (undefined1 (*) [32])(uVar21 + 0x80);
              local_2580 = (undefined1 (*) [16])*(undefined8 *)*pauVar1;
              uStack_2578 = *(undefined8 *)(uVar21 + 0x88);
              uStack_2570 = *(undefined8 *)(uVar21 + 0x90);
              uStack_2568 = *(undefined8 *)(uVar21 + 0x98);
              local_2420 = *(undefined1 (*) [32])(uVar21 + 0xa0);
              local_23c0 = *(undefined1 (*) [32])(uVar21 + 0xc0);
              local_2440 = *(undefined1 (*) [32])(uVar21 + 0xe0);
              auVar8 = *(undefined1 (*) [32])(uVar21 + 0x100);
              auVar9 = *(undefined1 (*) [32])(uVar21 + 0x120);
              auVar10 = *(undefined1 (*) [32])(uVar21 + 0x140);
              fVar7 = 1.0 - fVar44;
              auVar71._4_4_ = fVar7;
              auVar71._0_4_ = fVar7;
              auVar71._8_4_ = fVar7;
              auVar71._12_4_ = fVar7;
              auVar71._16_4_ = fVar7;
              auVar71._20_4_ = fVar7;
              auVar71._24_4_ = fVar7;
              auVar71._28_4_ = fVar7;
              local_2460._0_4_ = fVar44 * *(float *)(uVar21 + 0x1c0);
              local_2460._4_4_ = fVar44 * *(float *)(uVar21 + 0x1c4);
              local_2460._8_4_ = fVar44 * *(float *)(uVar21 + 0x1c8);
              local_2460._12_4_ = fVar44 * *(float *)(uVar21 + 0x1cc);
              local_2460._16_4_ = fVar44 * *(float *)(uVar21 + 0x1d0);
              local_2460._20_4_ = fVar44 * *(float *)(uVar21 + 0x1d4);
              local_2460._24_4_ = fVar44 * *(float *)(uVar21 + 0x1d8);
              local_2460._28_4_ = 0;
              auVar3._4_4_ = local_2520._4_4_ * auVar8._4_4_;
              auVar3._0_4_ = (float)local_2520 * auVar8._0_4_;
              auVar3._8_4_ = (float)uStack_2518 * auVar8._8_4_;
              auVar3._12_4_ = uStack_2518._4_4_ * auVar8._12_4_;
              auVar3._16_4_ = (float)uStack_2510 * auVar8._16_4_;
              auVar3._20_4_ = uStack_2510._4_4_ * auVar8._20_4_;
              auVar3._24_4_ = (float)uStack_2508 * auVar8._24_4_;
              auVar3._28_4_ = 0;
              auVar54._0_4_ = (float)local_2520 * auVar9._0_4_;
              auVar54._4_4_ = local_2520._4_4_ * auVar9._4_4_;
              auVar54._8_4_ = (float)uStack_2518 * auVar9._8_4_;
              auVar54._12_4_ = uStack_2518._4_4_ * auVar9._12_4_;
              auVar54._16_4_ = (float)uStack_2510 * auVar9._16_4_;
              auVar54._20_4_ = uStack_2510._4_4_ * auVar9._20_4_;
              auVar54._24_4_ = (float)uStack_2508 * auVar9._24_4_;
              auVar54._28_4_ = 0;
              auVar18._8_8_ = uStack_24f8;
              auVar18._0_8_ = local_2500;
              auVar18._16_8_ = uStack_24f0;
              auVar18._24_8_ = uStack_24e8;
              auVar38 = vfmadd231ps_fma(auVar3,auVar18,local_2420);
              auVar37 = vfmadd231ps_fma(auVar54,auVar18,local_23c0);
              auVar19._4_4_ = fStack_24dc;
              auVar19._0_4_ = local_24e0;
              auVar19._8_4_ = fStack_24d8;
              auVar19._12_4_ = fStack_24d4;
              auVar19._16_4_ = fStack_24d0;
              auVar19._20_4_ = fStack_24cc;
              auVar19._24_4_ = fStack_24c8;
              auVar19._28_4_ = fStack_24c4;
              auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar19,local_2400);
              auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar19,local_23e0);
              auVar70._8_4_ = 0x7fffffff;
              auVar70._0_8_ = 0x7fffffff7fffffff;
              auVar70._12_4_ = 0x7fffffff;
              auVar70._16_4_ = 0x7fffffff;
              auVar70._20_4_ = 0x7fffffff;
              auVar70._24_4_ = 0x7fffffff;
              auVar70._28_4_ = 0x7fffffff;
              auVar3 = vandps_avx(auVar70,ZEXT1632(auVar38));
              auVar65._8_4_ = 0x219392ef;
              auVar65._0_8_ = 0x219392ef219392ef;
              auVar65._12_4_ = 0x219392ef;
              auVar65._16_4_ = 0x219392ef;
              auVar65._20_4_ = 0x219392ef;
              auVar65._24_4_ = 0x219392ef;
              auVar65._28_4_ = 0x219392ef;
              auVar3 = vcmpps_avx(auVar3,auVar65,1);
              auVar4 = vblendvps_avx(ZEXT1632(auVar38),auVar65,auVar3);
              auVar3 = vandps_avx(auVar70,ZEXT1632(auVar37));
              auVar3 = vcmpps_avx(auVar3,auVar65,1);
              auVar54 = vblendvps_avx(ZEXT1632(auVar37),auVar65,auVar3);
              auVar5._4_4_ = local_2520._4_4_ * auVar10._4_4_;
              auVar5._0_4_ = (float)local_2520 * auVar10._0_4_;
              auVar5._8_4_ = (float)uStack_2518 * auVar10._8_4_;
              auVar5._12_4_ = uStack_2518._4_4_ * auVar10._12_4_;
              auVar5._16_4_ = (float)uStack_2510 * auVar10._16_4_;
              auVar5._20_4_ = uStack_2510._4_4_ * auVar10._20_4_;
              auVar5._24_4_ = (float)uStack_2508 * auVar10._24_4_;
              auVar5._28_4_ = auVar3._28_4_;
              auVar38 = vfmadd231ps_fma(auVar5,auVar18,local_2440);
              auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar19,*pauVar1);
              auVar3 = vandps_avx(auVar70,ZEXT1632(auVar38));
              auVar5 = vcmpps_avx(auVar3,auVar65,1);
              auVar3 = vblendvps_avx(ZEXT1632(auVar38),auVar65,auVar5);
              auVar6._4_4_ = fVar44 * *(float *)(uVar21 + 0x1e4);
              auVar6._0_4_ = fVar44 * *(float *)(uVar21 + 0x1e0);
              auVar6._8_4_ = fVar44 * *(float *)(uVar21 + 0x1e8);
              auVar6._12_4_ = fVar44 * *(float *)(uVar21 + 0x1ec);
              auVar6._16_4_ = fVar44 * *(float *)(uVar21 + 0x1f0);
              auVar6._20_4_ = fVar44 * *(float *)(uVar21 + 500);
              auVar6._24_4_ = fVar44 * *(float *)(uVar21 + 0x1f8);
              auVar6._28_4_ = uStack_2508._4_4_;
              auVar45 = vfmadd231ps_fma(local_2460,auVar71,ZEXT832(0) << 0x20);
              auVar60 = vfmadd231ps_fma(auVar6,auVar71,ZEXT832(0) << 0x20);
              auVar12._4_4_ = fVar44 * *(float *)(uVar21 + 0x204);
              auVar12._0_4_ = fVar44 * *(float *)(uVar21 + 0x200);
              auVar12._8_4_ = fVar44 * *(float *)(uVar21 + 0x208);
              auVar12._12_4_ = fVar44 * *(float *)(uVar21 + 0x20c);
              auVar12._16_4_ = fVar44 * *(float *)(uVar21 + 0x210);
              auVar12._20_4_ = fVar44 * *(float *)(uVar21 + 0x214);
              auVar12._24_4_ = fVar44 * *(float *)(uVar21 + 0x218);
              auVar12._28_4_ = (int)((ulong)uStack_24e8 >> 0x20);
              auVar61 = vfmadd231ps_fma(auVar12,auVar71,ZEXT832(0) << 0x20);
              auVar55._0_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x220);
              auVar55._4_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x224);
              auVar55._8_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x228);
              auVar55._12_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x22c);
              auVar55._16_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x230);
              auVar55._20_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x234);
              auVar55._24_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x238);
              auVar55._28_4_ = fVar7 + auVar5._28_4_;
              auVar50._0_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x240);
              auVar50._4_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x244);
              auVar50._8_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x248);
              auVar50._12_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x24c);
              auVar50._16_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x250);
              auVar50._20_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x254);
              auVar50._24_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 600);
              auVar50._28_4_ = fVar7 + 0.0;
              auVar5 = vrcpps_avx(auVar4);
              auVar72._0_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x260);
              auVar72._4_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x264);
              auVar72._8_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x268);
              auVar72._12_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x26c);
              auVar72._16_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x270);
              auVar72._20_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x274);
              auVar72._24_4_ = fVar7 + fVar44 * *(float *)(uVar21 + 0x278);
              auVar72._28_4_ = fVar7 + 0.0;
              auVar6 = vrcpps_avx(auVar54);
              auVar66._8_4_ = 0x3f800000;
              auVar66._0_8_ = &DAT_3f8000003f800000;
              auVar66._12_4_ = 0x3f800000;
              auVar66._16_4_ = 0x3f800000;
              auVar66._20_4_ = 0x3f800000;
              auVar66._24_4_ = 0x3f800000;
              auVar66._28_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(auVar4,auVar5,auVar66);
              auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar5,auVar5);
              auVar37 = vfnmadd213ps_fma(auVar54,auVar6,auVar66);
              auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar6,auVar6);
              auVar4 = vrcpps_avx(auVar3);
              auVar58 = vfnmadd213ps_fma(auVar3,auVar4,auVar66);
              auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar4,auVar4);
              auVar4._4_4_ = uStack_24bc;
              auVar4._0_4_ = local_24c0;
              auVar4._8_4_ = uStack_24b8;
              auVar4._12_4_ = uStack_24b4;
              auVar4._16_4_ = uStack_24b0;
              auVar4._20_4_ = uStack_24ac;
              auVar4._24_4_ = uStack_24a8;
              auVar4._28_4_ = uStack_24a4;
              auVar51 = vfmadd213ps_fma(auVar8,auVar4,*(undefined1 (*) [32])(uVar21 + 0x160));
              auVar8._4_4_ = uStack_249c;
              auVar8._0_4_ = local_24a0;
              auVar8._8_4_ = uStack_2498;
              auVar8._12_4_ = uStack_2494;
              auVar8._16_4_ = uStack_2490;
              auVar8._20_4_ = uStack_248c;
              auVar8._24_4_ = uStack_2488;
              auVar8._28_4_ = uStack_2484;
              auVar62 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar8,local_2420);
              auVar67 = ZEXT3264(local_25e0);
              auVar51 = vfmadd213ps_fma(auVar9,auVar4,*(undefined1 (*) [32])(uVar21 + 0x180));
              auVar48 = vfmadd213ps_fma(auVar10,auVar4,*(undefined1 (*) [32])(uVar21 + 0x1a0));
              auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar8,local_23c0);
              auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar8,local_2440);
              auVar9._4_4_ = uStack_247c;
              auVar9._0_4_ = local_2480;
              auVar9._8_4_ = uStack_2478;
              auVar9._12_4_ = uStack_2474;
              auVar9._16_4_ = uStack_2470;
              auVar9._20_4_ = uStack_246c;
              auVar9._24_4_ = uStack_2468;
              auVar9._28_4_ = uStack_2464;
              auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar9,local_2400);
              auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar9,local_23e0);
              auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar9,*pauVar1);
              auVar8 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar62));
              auVar64 = ZEXT3264(local_25c0);
              auVar9 = vsubps_avx(auVar55,ZEXT1632(auVar62));
              auVar10 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar51));
              auVar3 = vsubps_avx(auVar50,ZEXT1632(auVar51));
              auVar4 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar48));
              auVar54 = vsubps_avx(auVar72,ZEXT1632(auVar48));
              auVar13._4_4_ = auVar38._4_4_ * auVar8._4_4_;
              auVar13._0_4_ = auVar38._0_4_ * auVar8._0_4_;
              auVar13._8_4_ = auVar38._8_4_ * auVar8._8_4_;
              auVar13._12_4_ = auVar38._12_4_ * auVar8._12_4_;
              auVar13._16_4_ = auVar8._16_4_ * 0.0;
              auVar13._20_4_ = auVar8._20_4_ * 0.0;
              auVar13._24_4_ = auVar8._24_4_ * 0.0;
              auVar13._28_4_ = auVar8._28_4_;
              auVar14._4_4_ = auVar38._4_4_ * auVar9._4_4_;
              auVar14._0_4_ = auVar38._0_4_ * auVar9._0_4_;
              auVar14._8_4_ = auVar38._8_4_ * auVar9._8_4_;
              auVar14._12_4_ = auVar38._12_4_ * auVar9._12_4_;
              auVar14._16_4_ = auVar9._16_4_ * 0.0;
              auVar14._20_4_ = auVar9._20_4_ * 0.0;
              auVar14._24_4_ = auVar9._24_4_ * 0.0;
              auVar14._28_4_ = auVar9._28_4_;
              auVar68 = ZEXT3264(local_2600);
              auVar15._4_4_ = auVar37._4_4_ * auVar10._4_4_;
              auVar15._0_4_ = auVar37._0_4_ * auVar10._0_4_;
              auVar15._8_4_ = auVar37._8_4_ * auVar10._8_4_;
              auVar15._12_4_ = auVar37._12_4_ * auVar10._12_4_;
              auVar15._16_4_ = auVar10._16_4_ * 0.0;
              auVar15._20_4_ = auVar10._20_4_ * 0.0;
              auVar15._24_4_ = auVar10._24_4_ * 0.0;
              auVar15._28_4_ = auVar10._28_4_;
              auVar10._4_4_ = auVar58._4_4_ * auVar4._4_4_;
              auVar10._0_4_ = auVar58._0_4_ * auVar4._0_4_;
              auVar10._8_4_ = auVar58._8_4_ * auVar4._8_4_;
              auVar10._12_4_ = auVar58._12_4_ * auVar4._12_4_;
              auVar10._16_4_ = auVar4._16_4_ * 0.0;
              auVar10._20_4_ = auVar4._20_4_ * 0.0;
              auVar10._24_4_ = auVar4._24_4_ * 0.0;
              auVar10._28_4_ = auVar4._28_4_;
              auVar16._4_4_ = auVar37._4_4_ * auVar3._4_4_;
              auVar16._0_4_ = auVar37._0_4_ * auVar3._0_4_;
              auVar16._8_4_ = auVar37._8_4_ * auVar3._8_4_;
              auVar16._12_4_ = auVar37._12_4_ * auVar3._12_4_;
              auVar16._16_4_ = auVar3._16_4_ * 0.0;
              auVar16._20_4_ = auVar3._20_4_ * 0.0;
              auVar16._24_4_ = auVar3._24_4_ * 0.0;
              auVar16._28_4_ = auVar3._28_4_;
              auVar69 = ZEXT3264(local_2620);
              auVar17._4_4_ = auVar58._4_4_ * auVar54._4_4_;
              auVar17._0_4_ = auVar58._0_4_ * auVar54._0_4_;
              auVar17._8_4_ = auVar58._8_4_ * auVar54._8_4_;
              auVar17._12_4_ = auVar58._12_4_ * auVar54._12_4_;
              auVar17._16_4_ = auVar54._16_4_ * 0.0;
              auVar17._20_4_ = auVar54._20_4_ * 0.0;
              auVar17._24_4_ = auVar54._24_4_ * 0.0;
              auVar17._28_4_ = auVar54._28_4_;
              auVar8 = vpminsd_avx2(auVar15,auVar16);
              auVar9 = vpminsd_avx2(auVar10,auVar17);
              auVar8 = vmaxps_avx(auVar8,auVar9);
              auVar4 = vpminsd_avx2(auVar13,auVar14);
              auVar3 = vpmaxsd_avx2(auVar13,auVar14);
              auVar9 = vpmaxsd_avx2(auVar15,auVar16);
              auVar56 = ZEXT3264(local_2660);
              auVar10 = vpmaxsd_avx2(auVar10,auVar17);
              auVar10 = vminps_avx(auVar9,auVar10);
              auVar9 = vmaxps_avx(local_2600,auVar4);
              auVar63 = ZEXT3264(local_25a0);
              local_2680 = vmaxps_avx(auVar9,auVar8);
              auVar59 = ZEXT3264(local_2640);
              auVar8 = vminps_avx(auVar36._0_32_,auVar3);
              auVar8 = vminps_avx(auVar8,auVar10);
              auVar8 = vcmpps_avx(local_2680,auVar8,2);
              uVar34 = vmovmskps_avx(auVar8);
              unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar34);
            }
            else {
              auVar41._4_4_ = fVar44;
              auVar41._0_4_ = fVar44;
              auVar41._8_4_ = fVar44;
              auVar41._12_4_ = fVar44;
              auVar41._16_4_ = fVar44;
              auVar41._20_4_ = fVar44;
              auVar41._24_4_ = fVar44;
              auVar41._28_4_ = fVar44;
              auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar29),auVar41,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + uVar29));
              auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar63._0_32_,auVar69._0_32_);
              auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar30),auVar41,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + uVar30));
              auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar64._0_32_,auVar59._0_32_);
              auVar8 = vpmaxsd_avx2(ZEXT1632(auVar38),ZEXT1632(auVar37));
              auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar33),auVar41,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + uVar33));
              auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar29 ^ 0x20)),
                                        auVar41,*(undefined1 (*) [32])
                                                 (uVar21 + 0x40 + (uVar29 ^ 0x20)));
              auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar63._0_32_,auVar69._0_32_);
              auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar30 ^ 0x20)),
                                        auVar41,*(undefined1 (*) [32])
                                                 (uVar21 + 0x40 + (uVar30 ^ 0x20)));
              auVar58 = vfmadd213ps_fma(ZEXT1632(auVar58),auVar64._0_32_,auVar59._0_32_);
              auVar10 = vpminsd_avx2(ZEXT1632(auVar37),ZEXT1632(auVar58));
              auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar33 ^ 0x20)),
                                        auVar41,*(undefined1 (*) [32])
                                                 (uVar21 + 0x40 + (uVar33 ^ 0x20)));
              auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar67._0_32_,auVar56._0_32_);
              auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar67._0_32_,auVar56._0_32_);
              auVar9 = vpmaxsd_avx2(ZEXT1632(auVar38),auVar68._0_32_);
              local_2680 = vpmaxsd_avx2(auVar8,auVar9);
              auVar8 = vpminsd_avx2(ZEXT1632(auVar37),auVar36._0_32_);
              auVar8 = vpminsd_avx2(auVar10,auVar8);
              auVar8 = vcmpps_avx(local_2680,auVar8,2);
              if (uVar24 == 6) {
                auVar9 = vcmpps_avx(*(undefined1 (*) [32])(uVar21 + 0x1c0),auVar41,2);
                auVar10 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar21 + 0x1e0),1);
                auVar9 = vandps_avx(auVar9,auVar10);
                auVar8 = vandps_avx(auVar9,auVar8);
                auVar38 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
              }
              else {
                auVar38 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
              }
              auVar38 = vpsllw_avx(auVar38,0xf);
              auVar38 = vpacksswb_avx(auVar38,auVar38);
              unaff_R14 = (ulong)(byte)(SUB161(auVar38 >> 7,0) & 1 |
                                        (SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                        (SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                        (SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                        (SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                        (SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                        (SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                       SUB161(auVar38 >> 0x3f,0) << 7);
            }
          }
          if ((uVar22 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar20 = 4;
            }
            else {
              uVar21 = uVar22 & 0xfffffffffffffff0;
              lVar23 = 0;
              for (uVar22 = unaff_R14; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
              {
                lVar23 = lVar23 + 1;
              }
              iVar20 = 0;
              uVar28 = unaff_R14 - 1 & unaff_R14;
              uVar22 = *(ulong *)(uVar21 + lVar23 * 8);
              if (uVar28 != 0) {
                uVar24 = *(uint *)(local_2680 + lVar23 * 4);
                lVar23 = 0;
                for (uVar11 = uVar28; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
                uVar28 = uVar28 - 1 & uVar28;
                uVar11 = *(ulong *)(uVar21 + lVar23 * 8);
                uVar57 = *(uint *)(local_2680 + lVar23 * 4);
                if (uVar28 == 0) {
                  if (uVar24 < uVar57) {
                    *(ulong *)*pauVar31 = uVar11;
                    *(uint *)(*pauVar31 + 8) = uVar57;
                    pauVar31 = pauVar31 + 1;
                  }
                  else {
                    *(ulong *)*pauVar31 = uVar22;
                    *(uint *)(*pauVar31 + 8) = uVar24;
                    uVar22 = uVar11;
                    pauVar31 = pauVar31 + 1;
                  }
                }
                else {
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar22;
                  auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar24));
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar11;
                  auVar37 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar57));
                  lVar23 = 0;
                  for (uVar22 = uVar28; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000
                      ) {
                    lVar23 = lVar23 + 1;
                  }
                  uVar28 = uVar28 - 1 & uVar28;
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                  auVar58 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2680 + lVar23 * 4)));
                  if (uVar28 == 0) {
                    auVar51 = vpcmpgtd_avx(auVar37,auVar38);
                    auVar48 = vpshufd_avx(auVar51,0xaa);
                    auVar51 = vblendvps_avx(auVar37,auVar38,auVar48);
                    auVar38 = vblendvps_avx(auVar38,auVar37,auVar48);
                    auVar37 = vpcmpgtd_avx(auVar58,auVar51);
                    auVar48 = vpshufd_avx(auVar37,0xaa);
                    auVar37 = vblendvps_avx(auVar58,auVar51,auVar48);
                    auVar58 = vblendvps_avx(auVar51,auVar58,auVar48);
                    auVar51 = vpcmpgtd_avx(auVar58,auVar38);
                    auVar48 = vpshufd_avx(auVar51,0xaa);
                    auVar51 = vblendvps_avx(auVar58,auVar38,auVar48);
                    auVar38 = vblendvps_avx(auVar38,auVar58,auVar48);
                    *pauVar31 = auVar38;
                    pauVar31[1] = auVar51;
                    uVar22 = auVar37._0_8_;
                    pauVar31 = pauVar31 + 2;
                  }
                  else {
                    lVar23 = 0;
                    for (uVar22 = uVar28; (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    uVar28 = uVar28 - 1 & uVar28;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                    auVar51 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2680 + lVar23 * 4)));
                    if (uVar28 == 0) {
                      auVar48 = vpcmpgtd_avx(auVar37,auVar38);
                      auVar45 = vpshufd_avx(auVar48,0xaa);
                      auVar48 = vblendvps_avx(auVar37,auVar38,auVar45);
                      auVar38 = vblendvps_avx(auVar38,auVar37,auVar45);
                      auVar37 = vpcmpgtd_avx(auVar51,auVar58);
                      auVar45 = vpshufd_avx(auVar37,0xaa);
                      auVar37 = vblendvps_avx(auVar51,auVar58,auVar45);
                      auVar58 = vblendvps_avx(auVar58,auVar51,auVar45);
                      auVar51 = vpcmpgtd_avx(auVar58,auVar38);
                      auVar45 = vpshufd_avx(auVar51,0xaa);
                      auVar51 = vblendvps_avx(auVar58,auVar38,auVar45);
                      auVar38 = vblendvps_avx(auVar38,auVar58,auVar45);
                      auVar58 = vpcmpgtd_avx(auVar37,auVar48);
                      auVar45 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar37,auVar48,auVar45);
                      auVar37 = vblendvps_avx(auVar48,auVar37,auVar45);
                      auVar48 = vpcmpgtd_avx(auVar51,auVar37);
                      auVar45 = vpshufd_avx(auVar48,0xaa);
                      auVar48 = vblendvps_avx(auVar51,auVar37,auVar45);
                      auVar37 = vblendvps_avx(auVar37,auVar51,auVar45);
                      *pauVar31 = auVar38;
                      pauVar31[1] = auVar37;
                      pauVar31[2] = auVar48;
                      uVar22 = auVar58._0_8_;
                      pauVar32 = pauVar31 + 3;
                    }
                    else {
                      *pauVar31 = auVar38;
                      pauVar31[1] = auVar37;
                      pauVar31[2] = auVar58;
                      pauVar31[3] = auVar51;
                      lVar23 = 0x30;
                      do {
                        lVar26 = lVar23;
                        lVar23 = 0;
                        for (uVar22 = uVar28; (uVar22 & 1) == 0;
                            uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                          lVar23 = lVar23 + 1;
                        }
                        auVar40._8_8_ = 0;
                        auVar40._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                        auVar38 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_2680 + lVar23 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar31[1] + lVar26) = auVar38;
                        uVar28 = uVar28 - 1 & uVar28;
                        lVar23 = lVar26 + 0x10;
                      } while (uVar28 != 0);
                      pauVar32 = (undefined1 (*) [16])(pauVar31[1] + lVar26);
                      if (lVar26 + 0x10 != 0) {
                        lVar23 = 0x10;
                        pauVar25 = pauVar31;
                        do {
                          auVar38 = pauVar25[1];
                          uVar24 = *(uint *)(pauVar25[1] + 8);
                          pauVar25 = pauVar25 + 1;
                          lVar26 = lVar23;
                          do {
                            if (uVar24 <= *(uint *)(pauVar31[-1] + lVar26 + 8)) {
                              pauVar27 = (undefined1 (*) [16])(*pauVar31 + lVar26);
                              break;
                            }
                            *(undefined1 (*) [16])(*pauVar31 + lVar26) =
                                 *(undefined1 (*) [16])(pauVar31[-1] + lVar26);
                            lVar26 = lVar26 + -0x10;
                            pauVar27 = pauVar31;
                          } while (lVar26 != 0);
                          *pauVar27 = auVar38;
                          lVar23 = lVar23 + 0x10;
                        } while (pauVar32 != pauVar25);
                      }
                      uVar22 = *(ulong *)*pauVar32;
                    }
                    auVar63 = ZEXT3264(local_25a0);
                    auVar64 = ZEXT3264(local_25c0);
                    auVar67 = ZEXT3264(local_25e0);
                    auVar68 = ZEXT3264(local_2600);
                    auVar69 = ZEXT3264(local_2620);
                    auVar59 = ZEXT3264(local_2640);
                    auVar56 = ZEXT3264(local_2660);
                    pauVar31 = pauVar32;
                    iVar20 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar20 = 6;
          }
        } while (iVar20 == 0);
        local_2580 = pauVar31;
        if (iVar20 == 6) {
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar22 & 0xfffffffffffffff0) * 0x40))(local_2560,ray,context)
          ;
          auVar56 = ZEXT3264(local_2660);
          auVar59 = ZEXT3264(local_2640);
          auVar69 = ZEXT3264(local_2620);
          auVar68 = ZEXT3264(local_2600);
          auVar67 = ZEXT3264(local_25e0);
          auVar64 = ZEXT3264(local_25c0);
          auVar63 = ZEXT3264(local_25a0);
          fVar44 = (ray->super_RayK<1>).tfar;
          auVar36 = ZEXT3264(CONCAT428(fVar44,CONCAT424(fVar44,CONCAT420(fVar44,CONCAT416(fVar44,
                                                  CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,
                                                  fVar44))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }